

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::Swap
          (CodeGeneratorRequest *this,CodeGeneratorRequest *other)

{
  uint32 uVar1;
  int iVar2;
  string *psVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  
  if (other != this) {
    internal::RepeatedPtrFieldBase::Swap
              (&(this->file_to_generate_).super_RepeatedPtrFieldBase,
               &(other->file_to_generate_).super_RepeatedPtrFieldBase);
    psVar3 = this->parameter_;
    this->parameter_ = other->parameter_;
    other->parameter_ = psVar3;
    internal::RepeatedPtrFieldBase::Swap
              (&(this->proto_file_).super_RepeatedPtrFieldBase,
               &(other->proto_file_).super_RepeatedPtrFieldBase);
    uVar1 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar1;
    pvVar4 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar4;
    iVar2 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar2;
  }
  return;
}

Assistant:

void CodeGeneratorRequest::Swap(CodeGeneratorRequest* other) {
  if (other != this) {
    file_to_generate_.Swap(&other->file_to_generate_);
    std::swap(parameter_, other->parameter_);
    proto_file_.Swap(&other->proto_file_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}